

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

InterpretResult run(Vm *vm)

{
  undefined1 uVar1;
  byte bVar2;
  uint32_t index_00;
  CallFrame *pCVar3;
  uint8_t *puVar4;
  CrispyValue *pCVar5;
  undefined1 *puVar6;
  code *pcVar7;
  CallFrame **ppCVar8;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar9;
  long lVar10;
  HTItemKey key_00;
  HTItemKey key_01;
  HTItemKey key_02;
  HashTable content_00;
  _Bool _Var11;
  uint uVar12;
  undefined4 uVar13;
  InterpretResult IVar14;
  int iVar15;
  CrispyValue *pCVar16;
  ulong uVar17;
  CallFrame *pCVar18;
  ObjString *object_00;
  ObjDict *object_01;
  ObjList *pOVar19;
  undefined8 *puVar20;
  uint8_t *puVar21;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX;
  undefined8 extraout_RDX_00;
  double dVar22;
  double dVar23;
  CrispyValue value_00;
  CrispyValue first_19;
  CrispyValue first_20;
  CrispyValue first_21;
  CrispyValue first_22;
  CrispyValue first_23;
  CrispyValue first_24;
  CrispyValue value_01;
  CrispyValue value_02;
  CrispyValue value_03;
  CrispyValue CVar24;
  CrispyValue second_19;
  CrispyValue second_20;
  CrispyValue second_21;
  CrispyValue second_22;
  CrispyValue second_23;
  CrispyValue second_24;
  CrispyValue value_04;
  CrispyValue value_05;
  undefined8 uStack_878;
  ObjectType local_86c;
  ObjectType local_868;
  ObjectType local_864;
  uint8_t *local_860;
  uint8_t *local_858;
  uint8_t *local_850;
  uint8_t *local_848;
  uint8_t *local_840;
  uint8_t *local_838;
  uint8_t *local_830;
  uint8_t *local_828;
  uint8_t *local_820;
  uint8_t *local_818;
  uint8_t *local_810;
  bool local_801;
  uint8_t *local_800;
  bool local_7f1;
  uint8_t *local_7f0;
  uint8_t *local_7e8;
  uint8_t *local_7e0;
  uint8_t *local_7d8;
  ObjectType local_7cc;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  ulong local_7b8;
  ValueType local_7b0;
  undefined4 uStack_7ac;
  CrispyValue result_2;
  HTItemKey key_2;
  ObjString *key_string_1;
  ObjDict *dict_3;
  undefined1 auStack_778 [7];
  _Bool success_2;
  CrispyValue value_8;
  uint32_t index_7;
  ObjList *list_4;
  Object *obj_2;
  CrispyValue struct_val_1;
  CrispyValue key_val_1;
  undefined1 auStack_728 [7];
  _Bool success_1;
  CrispyValue value_7;
  int64_t index_6;
  ObjList *list_3;
  CrispyValue result_1;
  HTItemKey key_1;
  ObjString *key_string;
  Object *key_obj_1;
  ObjDict *dict_2;
  Object *obj_1;
  CrispyValue struct_val;
  CrispyValue key_val;
  _Bool success;
  int64_t index_5;
  ObjList *list_2;
  Object *key_obj;
  HTItemKey ht_key;
  ObjDict *dict_1;
  Object *obj;
  CrispyValue structure;
  CrispyValue key;
  CrispyValue value_6;
  ObjList *list_1;
  CrispyValue list_val_1;
  CrispyValue value_5;
  CrispyValue list_val;
  ObjList *list;
  CrispyValue value_4;
  ObjDict *dict;
  HashTable content;
  CrispyValue value_3;
  undefined4 uStack_59c;
  undefined4 uStack_58c;
  undefined4 uStack_57c;
  int local_570;
  CrispyValue value_2;
  uint8_t index_4;
  uint8_t index_3;
  CrispyValue first_18;
  CrispyValue second_18;
  CrispyValue first_17;
  CrispyValue second_17;
  CrispyValue first_16;
  CrispyValue second_16;
  CrispyValue first_15;
  CrispyValue second_15;
  CrispyValue first_14;
  CrispyValue second_14;
  CrispyValue first_13;
  CrispyValue second_13;
  CrispyValue value_1;
  CrispyValue value;
  CrispyValue val_5;
  CrispyValue val_4;
  uint8_t index_2;
  CrispyValue val_3;
  CallFrame *frame_1;
  uint8_t index_1;
  uint8_t scope_1;
  CrispyValue val_2;
  CallFrame *frame;
  uint8_t index;
  uint8_t scope;
  CrispyValue val_1;
  CrispyValue val;
  CrispyValue first_12;
  CrispyValue second_12;
  CrispyValue first_11;
  CrispyValue second_11;
  CrispyValue first_10;
  CrispyValue second_10;
  CrispyValue first_9;
  CrispyValue second_9;
  CrispyValue first_8;
  CrispyValue second_8;
  CrispyValue first_7;
  CrispyValue second_7;
  int local_2c0;
  CrispyValue first_6;
  CrispyValue second_6;
  int local_290;
  CrispyValue first_5;
  CrispyValue second_5;
  int local_260;
  CrispyValue base;
  CrispyValue exponent;
  CrispyValue first_4;
  CrispyValue second_4;
  int64_t second_int;
  int64_t first_int;
  CrispyValue first_3;
  CrispyValue second_3;
  CrispyValue first_2;
  CrispyValue second_2;
  CrispyValue first_1;
  CrispyValue second_1;
  ObjList *clone;
  ObjString *dest;
  ObjString *second_str;
  ObjString *first_str;
  Object *first_obj;
  CrispyValue first;
  CrispyValue second;
  InterpretResult result;
  int i_2;
  CrispyValue *before_sp;
  CallFrame *call_frame;
  int i_1;
  unsigned_long __vla_expr1;
  uint8_t expected;
  ObjLambda *lambda;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined8 local_d0;
  CrispyValue res;
  uint8_t *puStack_b8;
  int i;
  CrispyValue *start;
  unsigned_long __vla_expr0;
  uint8_t expected_1;
  ObjNativeFunc *n_fn;
  Object *object;
  CrispyValue *pos;
  undefined4 uStack_74;
  uint8_t num_args;
  CrispyValue one;
  CrispyValue zero;
  long stack_size;
  OP_CODE instruction;
  ValueArray *variables;
  CrispyValue *const_values;
  uint8_t *code;
  CrispyValue *sp;
  uint8_t *ip;
  CallFrame *curr_frame;
  Vm *vm_local;
  
  pCVar3 = (vm->frames).frame_pointers[vm->frame_count - 1];
  puVar4 = (pCVar3->code_buffer).code;
  pCVar5 = (pCVar3->constants).values;
  code = (uint8_t *)vm->sp;
  sp = (CrispyValue *)pCVar3->ip;
  do {
    if ((long)code - (long)vm >> 4 < 0) {
      printf("Negative stack pointer\n");
      return INTERPRET_RUNTIME_ERROR;
    }
    pCVar16 = (CrispyValue *)((long)&sp->type + 1);
    uVar1 = (undefined1)sp->type;
    uVar17 = (ulong)(byte)uVar1;
    local_7b8 = uVar17;
    switch(uVar17) {
    case 0:
      local_858 = code;
      CVar24 = create_bool(false);
      *(ulong *)local_858 = CONCAT44(uStack_59c,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_858 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 1:
      local_848 = code;
      CVar24 = create_bool(true);
      *(ulong *)local_848 = CONCAT44(uStack_57c,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_848 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 2:
      local_850 = code;
      CVar24 = create_bool(false);
      *(ulong *)local_850 = CONCAT44(uStack_58c,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_850 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 3:
      local_860 = code;
      CVar24 = create_nil();
      *(ulong *)local_860 = CONCAT44(value_3.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_860 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 4:
      uVar17 = *(ulong *)(code + -0x10);
      aVar9 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)
              ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->o_value;
      puVar21 = code + -0x20;
      pOVar19 = *(ObjList **)(code + -0x18);
      first_obj._0_4_ = (int)*(undefined8 *)(code + -0x20);
      first.field_1.p_value._0_4_ = (undefined4)uVar17;
      if (((int)first_obj == 1) && (first.field_1.p_value._0_4_ == 1)) {
        *(undefined8 *)puVar21 = *(undefined8 *)(code + -0x20);
        *(double *)(code + -0x18) = aVar9.d_value + (double)pOVar19;
        code = code + -0x10;
        sp = pCVar16;
      }
      else {
        if ((int)first_obj != 2) {
          fprintf(_stderr,"Invalid target for addition\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        (pOVar19->object).marked = '\x01';
        local_7cc = (pOVar19->object).type;
        if (local_7cc == OBJ_STRING) {
          if ((first.field_1.p_value._0_4_ != 2) || ((aVar9.o_value)->type != OBJ_STRING)) {
            fprintf(_stderr,
                    "Only strings can be appended to strings. Consider using the \'str\' function\n"
                   );
            return INTERPRET_RUNTIME_ERROR;
          }
          (aVar9.o_value)->marked = '\x01';
          object_00 = new_empty_string(vm,(pOVar19->content).cap + *(long *)(aVar9.p_value + 0x10));
          memcpy(object_00->start,(void *)(pOVar19->content).count,(pOVar19->content).cap);
          memcpy(object_00->start + (pOVar19->content).cap,*(void **)(aVar9.p_value + 0x18),
                 *(size_t *)(aVar9.p_value + 0x10));
          local_7d8 = puVar21;
          CVar24 = create_object(&object_00->object);
          *(ulong *)local_7d8 = CONCAT44(clone._4_4_,CVar24.type);
          ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_7d8 + 8))->p_value =
               (uint64_t)CVar24.field_1;
        }
        else {
          if (local_7cc != OBJ_LIST) {
            fprintf(_stderr,"Invalid target for addition\n");
            return INTERPRET_RUNTIME_ERROR;
          }
          pOVar19 = clone_list(vm,pOVar19);
          value_02._0_8_ = uVar17 & 0xffffffff;
          value_02.field_1.o_value = (Object *)aVar9.p_value;
          list_append(pOVar19,value_02);
          local_7e0 = puVar21;
          CVar24 = create_object(&pOVar19->object);
          *(ulong *)local_7e0 = CONCAT44(second_1.field_1.p_value._4_4_,CVar24.type);
          ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_7e0 + 8))->p_value =
               (uint64_t)CVar24.field_1;
        }
        code = code + -0x10;
        sp = pCVar16;
      }
      break;
    case 5:
      second_2.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x20);
      if (second_2.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      first_1.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (first_1.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      *(undefined8 *)(code + -0x20) = *(undefined8 *)(code + -0x20);
      *(double *)(code + -0x18) = *(double *)(code + -0x18) - *(double *)(code + -8);
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 6:
      second_3.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x20);
      if (second_3.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      first_2.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (first_2.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      *(undefined8 *)(code + -0x20) = *(undefined8 *)(code + -0x20);
      *(double *)(code + -0x18) = *(double *)(code + -0x18) * *(double *)(code + -8);
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 7:
      dVar23 = *(double *)(code + -8);
      exponent.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x20);
      if (exponent.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      first_4.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (first_4.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      if ((dVar23 == 0.0) && (!NAN(dVar23))) {
        panic(vm,"Cannot divide by zero\n");
      }
      *(undefined8 *)(code + -0x20) = *(undefined8 *)(code + -0x20);
      *(double *)(code + -0x18) = *(double *)(code + -0x18) / dVar23;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 8:
      first_int._0_4_ = (int)*(undefined8 *)(code + -0x20);
      if (((int)first_int != 1) ||
         (first_3.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10),
         first_3.field_1.p_value._0_4_ != 1)) {
        fprintf(_stderr,"Modulo operator (%%) only works on numbers\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      local_7e8 = code + -0x20;
      CVar24 = create_number((double)((long)*(double *)(code + -0x18) % (long)*(double *)(code + -8)
                                     ));
      *(ulong *)local_7e8 = CONCAT44(second_4.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_7e8 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 9:
      local_7f0 = code + -0x20;
      local_260 = (int)*(undefined8 *)(code + -0x20);
      if (local_260 != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      base.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (base.field_1.p_value._0_4_ != 1) {
        return INTERPRET_RUNTIME_ERROR;
      }
      dVar23 = pow(*(double *)(code + -0x18),*(double *)(code + -8));
      CVar24 = create_number(dVar23);
      *(ulong *)local_7f0 = CONCAT44(second_5.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_7f0 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 10:
      local_810 = code + -0x20;
      local_2c0 = (int)*(undefined8 *)(code + -0x20);
      if (local_2c0 != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      first_6.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (first_6.field_1.p_value._0_4_ != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      local_801 = *(long *)(code + -0x18) != 0 && *(long *)(code + -8) != 0;
      CVar24 = create_bool(local_801);
      *(ulong *)local_810 = CONCAT44(second_7.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_810 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0xb:
      local_800 = code + -0x20;
      local_290 = (int)*(undefined8 *)(code + -0x20);
      if (local_290 != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      first_5.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (first_5.field_1.p_value._0_4_ != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      local_7f1 = *(long *)(code + -0x18) != 0 || *(long *)(code + -8) != 0;
      CVar24 = create_bool(local_7f1);
      *(ulong *)local_800 = CONCAT44(second_6.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_800 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0xc:
      local_818 = code + -0x20;
      first_19._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_19._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_19.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_19.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_19,second_19);
      CVar24 = create_bool(iVar15 == 0);
      *(ulong *)local_818 = CONCAT44(second_8.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_818 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0xd:
      local_820 = code + -0x20;
      first_20._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_20._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_20.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_20.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_20,second_20);
      CVar24 = create_bool(iVar15 != 0);
      *(ulong *)local_820 = CONCAT44(second_9.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_820 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0xe:
      local_838 = code + -0x20;
      first_23._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_23._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_23.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_23.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_23,second_23);
      CVar24 = create_bool(0 < iVar15);
      *(ulong *)local_838 = CONCAT44(second_12.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_838 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0xf:
      local_840 = code + -0x20;
      first_24._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_24._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_24.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_24.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_24,second_24);
      CVar24 = create_bool(iVar15 < 0);
      *(ulong *)local_840 = CONCAT44(val.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_840 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x10:
      local_828 = code + -0x20;
      first_21._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_21._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_21.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_21.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_21,second_21);
      CVar24 = create_bool(-1 < iVar15);
      *(ulong *)local_828 = CONCAT44(second_10.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_828 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x11:
      local_830 = code + -0x20;
      first_22._0_8_ = *(ulong *)(code + -0x20) & 0xffffffff;
      second_22._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      first_22.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value;
      second_22.field_1.p_value =
           ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      iVar15 = cmp_values(first_22,second_22);
      CVar24 = create_bool(iVar15 < 1);
      *(ulong *)local_830 = CONCAT44(second_11.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(local_830 + 8))->p_value =
           (uint64_t)CVar24.field_1;
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x12:
      pCVar16 = pCVar5 + *(byte *)((long)&sp->type + 1);
      *(undefined8 *)code = *(undefined8 *)pCVar16;
      *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8) = pCVar16->field_1;
      code = code + 0x10;
      sp = (CrispyValue *)((long)&sp->type + 2);
      break;
    case 0x13:
      pCVar16 = pCVar5 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                             *(byte *)((long)&sp->type + 2));
      *(undefined8 *)code = *(undefined8 *)pCVar16;
      *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8) = pCVar16->field_1;
      code = code + 0x10;
      sp = (CrispyValue *)((long)&sp->type + 3);
      break;
    case 0x14:
      CVar24 = create_number(0.0);
      *(ulong *)code = CONCAT44(one.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8))->p_value = (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x15:
      CVar24 = create_number(1.0);
      *(ulong *)code = CONCAT44(uStack_74,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8))->p_value = (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x16:
      value_04._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      value_04.field_1.p_value = ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value
      ;
      write_at(&pCVar3->variables,(ulong)*(byte *)((long)&sp->type + 1),value_04);
      code = code + -0x10;
      sp = (CrispyValue *)((long)&sp->type + 2);
      break;
    case 0x17:
      pCVar16 = (pCVar3->variables).values + *(byte *)((long)&sp->type + 1);
      aVar9 = pCVar16->field_1;
      *(undefined8 *)code = *(undefined8 *)pCVar16;
      *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8) = aVar9;
      code = code + 0x10;
      sp = (CrispyValue *)((long)&sp->type + 2);
      break;
    case 0x18:
      pCVar16 = ((vm->frames).frame_pointers[(int)(*(byte *)((long)&sp->type + 1) - 1)]->variables).
                values + *(byte *)((long)&sp->type + 2);
      aVar9 = pCVar16->field_1;
      *(undefined8 *)code = *(undefined8 *)pCVar16;
      *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8) = aVar9;
      code = code + 0x10;
      sp = (CrispyValue *)((long)&sp->type + 3);
      break;
    case 0x19:
      aVar9 = *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8);
      pCVar16 = ((vm->frames).frame_pointers[(int)(*(byte *)((long)&sp->type + 1) - 1)]->variables).
                values + *(byte *)((long)&sp->type + 2);
      *(undefined8 *)pCVar16 = *(undefined8 *)(code + -0x10);
      pCVar16->field_1 = aVar9;
      code = code + -0x10;
      sp = (CrispyValue *)((long)&sp->type + 3);
      break;
    case 0x1a:
      *(undefined8 *)code = *(undefined8 *)(code + -0x10);
      *(undefined8 *)(code + 8) = *(undefined8 *)(code + -8);
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x1b:
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x1c:
      pCVar16 = (CrispyValue *)((long)&sp->type + 2);
      bVar2 = *(byte *)((long)&sp->type + 1);
      if (*(int *)(code + (long)(int)(uint)bVar2 * -0x10 + -0x10) != 2) {
        fprintf(_stderr,"Trying to call primitive CrispyValue\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      puVar6 = *(undefined1 **)(code + (long)(int)(uint)bVar2 * -0x10 + -8);
      *puVar6 = 1;
      sp = pCVar16;
      if (*(int *)(puVar6 + 4) == 2) {
        if (puVar6[0x11] != bVar2) {
          fprintf(_stderr,"Invalid number of arguments. Expected %d, but got %d\n",
                  (ulong)(byte)puVar6[0x11],(ulong)bVar2);
          return INTERPRET_RUNTIME_ERROR;
        }
        lVar10 = (ulong)bVar2 * -0x10;
        puVar20 = &uStack_878 + (ulong)bVar2 * -2;
        puStack_b8 = code + (long)(int)(uint)bVar2 * -0x10;
        for (res.field_1.p_value._4_4_ = 0; (int)res.field_1.p_value._4_4_ < (int)(uint)bVar2;
            res.field_1.p_value._4_4_ = res.field_1.p_value._4_4_ + 1) {
          puVar20[(long)(int)res.field_1.p_value._4_4_ * 2] = *(undefined8 *)puStack_b8;
          (puVar20 + (long)(int)res.field_1.p_value._4_4_ * 2)[1] = *(undefined8 *)(puStack_b8 + 8);
          code = code + -0x10;
          puStack_b8 = puStack_b8 + 0x10;
        }
        local_7c0 = puVar20;
        if ((puVar6[0x10] & 1) == 0) {
          pcVar7 = *(code **)(puVar6 + 0x18);
          *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x105046;
          uVar13 = (*pcVar7)();
          local_d0 = CONCAT44(uStack_ec,uVar13);
          res._0_8_ = extraout_RDX_00;
LAB_0010506f:
          *(undefined8 *)(code + -0x10) = local_d0;
          *(undefined8 *)(code + -8) = res._0_8_;
          lambda._4_4_ = 5;
        }
        else {
          vm->sp = (CrispyValue *)code;
          vm->current_status = VM_STATUS_NO_GC;
          pcVar7 = *(code **)(puVar6 + 0x18);
          *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x104fbf;
          uVar12 = (*pcVar7)();
          local_d0 = CONCAT44(uStack_dc,uVar12);
          vm->current_status = VM_STATUS_RUNNING;
          res._0_8_ = extraout_RDX;
          if ((vm->err_flag & 1U) == 0) goto LAB_0010506f;
          vm->err_flag = false;
          value_00._4_4_ = 0;
          value_00.type = uVar12;
          *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x105027;
          value_00.field_1.d_value = extraout_RDX.d_value;
          print_value(value_00,true,false);
          lambda._4_4_ = 4;
        }
        if (lambda._4_4_ == 4) {
          return INTERPRET_RUNTIME_ERROR;
        }
      }
      else {
        if (*(int *)(puVar6 + 4) != 1) {
          fprintf(_stderr,"Trying to call non callable Object\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        if (puVar6[0x10] != bVar2) {
          fprintf(_stderr,"Invalid number of arguments. Expected %d, but got %d\n",
                  (ulong)(byte)puVar6[0x10],(ulong)bVar2);
          return INTERPRET_RUNTIME_ERROR;
        }
        lVar10 = (ulong)bVar2 * -0x10;
        puVar20 = &uStack_878 + (ulong)bVar2 * -2;
        for (call_frame._4_4_ = 0; puVar21 = code, call_frame._4_4_ < (int)(uint)bVar2;
            call_frame._4_4_ = call_frame._4_4_ + 1) {
          puVar20[(long)call_frame._4_4_ * 2] = *(undefined8 *)(code + -0x10);
          (puVar20 + (long)call_frame._4_4_ * 2)[1] = *(undefined8 *)(code + -8);
          code = code + -0x10;
        }
        pCVar18 = *(CallFrame **)(puVar6 + 0x18);
        local_7c8 = puVar20;
        *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x1051e1;
        pCVar18 = new_temp_call_frame(pCVar18);
        index_00 = vm->frame_count;
        vm->frame_count = index_00 + 1;
        *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x105214;
        frames_write_at(&vm->frames,index_00,pCVar18);
        for (second.field_1.p_value._4_4_ = 0; (int)second.field_1.p_value._4_4_ < (int)(uint)bVar2;
            second.field_1.p_value._4_4_ = second.field_1.p_value._4_4_ + 1) {
          *(undefined8 *)code = local_7c8[(long)(int)second.field_1.p_value._4_4_ * 2];
          *(undefined8 *)(code + 8) = (local_7c8 + (long)(int)second.field_1.p_value._4_4_ * 2)[1];
          code = code + 0x10;
        }
        vm->sp = (CrispyValue *)code;
        *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x105293;
        IVar14 = run(vm);
        ppCVar8 = (vm->frames).frame_pointers;
        uVar12 = vm->frame_count - 1;
        vm->frame_count = uVar12;
        pCVar18 = ppCVar8[uVar12];
        *(undefined8 *)(&stack0xfffffffffffff780 + lVar10) = 0x1052c2;
        temp_call_frame_free(pCVar18);
        if (IVar14 == INTERPRET_OK) {
          lambda._4_4_ = 5;
          code = puVar21;
        }
        else {
          lambda._4_4_ = 1;
          vm_local._4_4_ = IVar14;
        }
        if (lambda._4_4_ == 1) {
          return vm_local._4_4_;
        }
      }
      break;
    case 0x1d:
      CVar24 = create_number(*(double *)(code + -8) * -1.0);
      *(ulong *)(code + -0x10) = CONCAT44(val_1.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value = (uint64_t)CVar24.field_1
      ;
      sp = pCVar16;
      break;
    case 0x1e:
      local_570 = (int)*(undefined8 *)(code + -0x10);
      if (local_570 != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      *(undefined8 *)(code + -0x10) = *(undefined8 *)(code + -0x10);
      *(long *)(code + -8) = (long)(int)(uint)(*(long *)(code + -8) == 0);
      sp = pCVar16;
      break;
    case 0x1f:
      content.buckets = *(HTItem ***)(code + -0x10);
      aVar9 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)
              ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      printf("> ");
      value_01._0_8_ = (ulong)content.buckets & 0xffffffff;
      value_01.field_1 =
           (anon_union_8_3_4e733eb7_for_CrispyValue_1)
           (anon_union_8_3_4e733eb7_for_CrispyValue_1)aVar9.p_value;
      print_value(value_01,true,true);
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x20:
      ht_init((HashTable *)&dict,HT_KEY_OBJSTRING,8,free_objstring);
      content_00.size = content.key_type;
      content_00._12_4_ = content.cap;
      content_00._0_8_ = dict;
      content_00.free_callback = (_func_void_HTItem_ptr *)content._8_8_;
      content_00.buckets = (HTItem **)content.free_callback;
      object_01 = new_dict(vm,content_00);
      CVar24 = create_object(&object_01->object);
      *(ulong *)code = CONCAT44(list._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8))->p_value = (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x21:
      pOVar19 = new_list(vm,0);
      CVar24 = create_object(&pOVar19->object);
      *(ulong *)code = CONCAT44(value_5.field_1.p_value._4_4_,CVar24.type);
      ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8))->p_value = (uint64_t)CVar24.field_1;
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x22:
      list_1._0_4_ = (int)*(undefined8 *)(code + -0x20);
      if (((int)list_1 != 2) || (((*(ObjList **)(code + -0x18))->object).type != OBJ_LIST)) {
        fprintf(_stderr,"Can only put values into lists\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      value_03._0_8_ = *(ulong *)(code + -0x10) & 0xffffffff;
      value_03.field_1.p_value = ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value
      ;
      list_append(*(ObjList **)(code + -0x18),value_03);
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x23:
      uVar17 = *(ulong *)(code + -0x10);
      aVar9 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)
              ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->p_value;
      dVar23 = *(double *)(code + -0x18);
      pOVar19 = *(ObjList **)(code + -0x28);
      obj._0_4_ = (int)*(undefined8 *)(code + -0x30);
      if ((int)obj != 2) {
        fprintf(_stderr,"Trying to retrieve an element from a primitive value\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      local_864 = (pOVar19->object).type;
      structure.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x20);
      if (local_864 == OBJ_DICT) {
        if (structure.field_1.p_value._0_4_ != 2) {
          fprintf(_stderr,"Only strings can be used as indices for dictionaries\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        if (*(int *)((long)dVar23 + 4) != 0) {
          fprintf(_stderr,"Only strings can be used as indices for dictionaries\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        key_02._8_8_ = ht_key.key_c_string;
        key_02._0_8_ = dVar23;
        value_05._0_8_ = uVar17 & 0xffffffff;
        value_05.field_1.p_value = aVar9.p_value;
        ht_put((HashTable *)&pOVar19->content,key_02,value_05);
        code = code + -0x20;
        sp = pCVar16;
      }
      else {
        if (local_864 != OBJ_LIST) {
          fprintf(_stderr,"Invalid receiver for set operation\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        if (structure.field_1.p_value._0_4_ != 1) {
LAB_00106d93:
          fprintf(_stderr,"Only integers can be used as indices for lists\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar22 = floor(dVar23);
        if ((dVar22 != dVar23) || (NAN(dVar22) || NAN(dVar23))) goto LAB_00106d93;
        CVar24._0_8_ = uVar17 & 0xffffffff;
        CVar24.field_1.p_value = aVar9.p_value;
        _Var11 = list_add(pOVar19,(long)dVar23,CVar24);
        code = code + -0x20;
        sp = pCVar16;
        if (!_Var11) {
          fprintf(_stderr,"Index out of bounds\n");
          return INTERPRET_RUNTIME_ERROR;
        }
      }
      break;
    case 0x24:
      dVar23 = *(double *)(code + -8);
      pOVar19 = *(ObjList **)(code + -0x18);
      obj_1._0_4_ = (int)*(undefined8 *)(code + -0x20);
      if ((int)obj_1 != 2) {
        fprintf(_stderr,"Trying to retrieve an element from a primitive value\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      local_868 = (pOVar19->object).type;
      struct_val.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (local_868 == OBJ_DICT) {
        if (struct_val.field_1.p_value._0_4_ != 2) {
          fprintf(_stderr,"Only strings can be used as indices for dictionaries\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        if (*(int *)((long)dVar23 + 4) != 0) {
          fprintf(_stderr,"Only strings can be used as indices for dictionaries\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        key_01._8_8_ = key_1.key_c_string;
        key_01._0_8_ = dVar23;
        CVar24 = ht_get((HashTable *)&pOVar19->content,key_01);
        *(ulong *)(code + -0x20) = CONCAT44(list_3._4_4_,CVar24.type);
        ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -0x18))->p_value =
             (uint64_t)CVar24.field_1;
      }
      else {
        if (local_868 != OBJ_LIST) {
          fprintf(_stderr,"Invalid receiver for get operation\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        if (struct_val.field_1.p_value._0_4_ != 1) {
LAB_00106fea:
          fprintf(_stderr,"Only integers can be used as indices for lists\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar22 = floor(dVar23);
        if ((dVar22 != dVar23) || (NAN(dVar22) || NAN(dVar23))) goto LAB_00106fea;
        value_7.field_1.p_value = (uint64_t)dVar23;
        _Var11 = list_get(pOVar19,value_7.field_1.p_value,(CrispyValue *)auStack_728);
        if (!_Var11) {
          fprintf(_stderr,"Index out of bounds\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        *(undefined8 *)(code + -0x20) = _auStack_728;
        *(undefined8 *)(code + -0x18) = value_7._0_8_;
      }
      code = code + -0x10;
      sp = pCVar16;
      break;
    case 0x25:
      aVar9 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)
              ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + -8))->d_value;
      pOVar19 = *(ObjList **)(code + -0x18);
      obj_2._0_4_ = (int)*(undefined8 *)(code + -0x20);
      if ((int)obj_2 != 2) {
        fprintf(_stderr,"Trying to retrieve an element from a primitive value\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      local_86c = (pOVar19->object).type;
      if (local_86c == OBJ_DICT) {
        key_00._8_8_ = key_2.key_c_string;
        key_00._0_8_ = aVar9.p_value;
        result_2.field_1 = aVar9;
        CVar24 = ht_get((HashTable *)&pOVar19->content,key_00);
        result_2._0_8_ = CVar24.field_1;
        local_7b0 = CVar24.type;
        *(ulong *)code = CONCAT44(uStack_7ac,local_7b0);
        ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(code + 8))->p_value = result_2._0_8_;
      }
      else {
        if (local_86c != OBJ_LIST) {
          fprintf(_stderr,"Invalid receiver for get operation\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        struct_val_1.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
        if (struct_val_1.field_1.p_value._0_4_ != 1) {
LAB_0010716e:
          fprintf(_stderr,"Only integers can be used as indices for lists\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar23 = floor(aVar9.d_value);
        if ((dVar23 != aVar9.d_value) || (NAN(dVar23) || NAN(aVar9.d_value))) goto LAB_0010716e;
        value_8.field_1.p_value._4_4_ = (undefined4)(long)aVar9.d_value;
        _Var11 = list_get(pOVar19,(long)aVar9.d_value & 0xffffffff,(CrispyValue *)auStack_778);
        if (!_Var11) {
          fprintf(_stderr,"Index out of bounds\n");
          return INTERPRET_RUNTIME_ERROR;
        }
        *(undefined8 *)code = _auStack_778;
        *(undefined8 *)(code + 8) = value_8._0_8_;
      }
      code = code + 0x10;
      sp = pCVar16;
      break;
    case 0x26:
      sp = (CrispyValue *)
           (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                         *(byte *)((long)&sp->type + 2)));
      break;
    case 0x27:
      if (*(long *)(code + -0x18) == *(long *)(code + -8)) {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      break;
    case 0x28:
      value_1.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (value_1.field_1.p_value._0_4_ != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      if (*(long *)(code + -8) == 1) {
        code = code + -0x10;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      else {
        code = code + -0x10;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      break;
    case 0x29:
      second_13.field_1.p_value._0_4_ = (undefined4)*(undefined8 *)(code + -0x10);
      if (second_13.field_1.p_value._0_4_ != 3) {
        return INTERPRET_RUNTIME_ERROR;
      }
      if (*(long *)(code + -8) == 1) {
        code = code + -0x10;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      else {
        code = code + -0x10;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      break;
    case 0x2a:
      if (*(long *)(code + -0x18) == *(long *)(code + -8)) {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      break;
    case 0x2b:
      if (*(ulong *)(code + -0x18) < *(ulong *)(code + -8)) {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      break;
    case 0x2c:
      if (*(ulong *)(code + -8) < *(ulong *)(code + -0x18)) {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      break;
    case 0x2d:
      if (*(ulong *)(code + -8) < *(ulong *)(code + -0x18)) {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      break;
    case 0x2e:
      if (*(ulong *)(code + -0x18) < *(ulong *)(code + -8)) {
        code = code + -0x20;
        sp = (CrispyValue *)((long)&sp->type + 3);
      }
      else {
        code = code + -0x20;
        sp = (CrispyValue *)
             (puVar4 + (int)(uint)CONCAT11(*(byte *)((long)&sp->type + 1),
                                           *(byte *)((long)&sp->type + 2)));
      }
      break;
    case 0x2f:
      bVar2 = *(byte *)((long)&sp->type + 1);
      pCVar16 = (pCVar3->variables).values;
      pCVar16[bVar2].field_1.d_value = pCVar16[bVar2].field_1.d_value + 1.0;
      sp = (CrispyValue *)((long)&sp->type + 2);
      break;
    case 0x30:
      bVar2 = *(byte *)((long)&sp->type + 1);
      pCVar16 = (pCVar3->variables).values;
      pCVar16[bVar2].field_1.d_value = pCVar16[bVar2].field_1.d_value + -1.0;
      sp = (CrispyValue *)((long)&sp->type + 2);
      break;
    case 0x31:
      return INTERPRET_OK;
    default:
      printf("Unknown instruction %d\n",(ulong)(byte)uVar1);
      return INTERPRET_RUNTIME_ERROR;
    }
  } while( true );
}

Assistant:

static InterpretResult run(Vm *vm) {
    CallFrame *curr_frame = CURR_FRAME(vm);

    register uint8_t *ip = curr_frame->ip;
    register CrispyValue *sp = vm->sp;
    register uint8_t *code = curr_frame->code_buffer.code;

    CrispyValue *const_values = curr_frame->constants.values;
    ValueArray *variables = &curr_frame->variables;

#define READ_BYTE() (ip += 1, ip[-1])
#define READ_SHORT() (ip += 2, (uint16_t)((ip[-2] << 8) | ip[-1]))
#define READ_CONST() (const_values[READ_BYTE()])
#define READ_CONST_W() (ip += 2, const_values[(ip[-2] << 8) | ip[-1]])
#define READ_VAR() (variables->values[READ_BYTE()])
#define POP() (*(sp -= 1))
#define PUSH(value) (*sp = (value), sp += 1)
#define PEEK() (*(sp - 1))
#define BINARY_OP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (!CHECK_NUM(first) || !CHECK_NUM(second))            \
            goto ERROR;                                         \
        first.d_value = first.d_value op second.d_value;        \
        PUSH(first);                                            \
    } while (false)

#define COND_JUMP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (first.p_value op second.p_value) {                  \
            ip = code + READ_SHORT();                           \
        } else {                                                \
            READ_SHORT();                                       \
        }                                                       \
    } while(false)

    while (true) {
        OP_CODE instruction;

#if DEBUG_TRACE_EXECUTION
        {
            printf("-----\n");
            long stack_size = sp - vm->stack;
            for (int i = 0; i < stack_size; ++i) {
                printf("[%d] ", i);
                print_value(vm->stack[i], false, true);
                print_type(vm->stack[i]);
            }
            printf("sp: %li\n", stack_size);
            printf("ip: %li\n", ip - code);
            disassemble_instruction(vm, (int) (ip - code));
            printf("-----\n");
        }
#endif

#if DEBUG_TYPE_CHECK
        {
            long stack_size = sp - vm->stack;
            if (stack_size < 0) {
                printf("Negative stack pointer\n");
                goto ERROR;
            }
        }
#endif

        switch (instruction = (OP_CODE) READ_BYTE()) {
            case OP_RETURN:
                return INTERPRET_OK;
            case OP_LDC:
                PUSH(READ_CONST());
                break;
            case OP_LDC_W: {
                PUSH(READ_CONST_W());
                break;
            }
            case OP_LDC_0: {
                CrispyValue zero = create_number(0.0);
                PUSH(zero);
                break;
            }
            case OP_LDC_1: {
                CrispyValue one = create_number(1.0);
                PUSH(one);
                break;
            }
            case OP_CALL: {
                uint8_t num_args = READ_BYTE();
                CrispyValue *pos = (sp - num_args - 1);

                if (pos->type != OBJECT) {
                    fprintf(stderr, "Trying to call primitive CrispyValue\n");
                    goto ERROR;
                }

                Object *object = pos->o_value;
                object->marked = true;

                if (object->type == OBJ_NATIVE_FUNC) {
                    ObjNativeFunc *n_fn = (ObjNativeFunc *) object;
                    uint8_t expected = n_fn->num_params;

                    if (expected != num_args) {
                        fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                        goto ERROR;
                    }

                    // Pop arguments from stack
                    CrispyValue args[num_args];
                    CrispyValue *start = sp - num_args;

                    for (int i = 0; i < num_args; ++i) {
                        args[i] = *(start++);
                        --sp;
                    }

                    CrispyValue res;
                    if (n_fn->system_func) {
                        vm->sp = sp;

                        // Disable garbage collection while executing native functions
                        vm->current_status = VM_STATUS_NO_GC;
                        res = ((CrispyValue (*)(CrispyValue *, Vm *vm)) n_fn->func_ptr)(args, vm);
                        vm->current_status = VM_STATUS_RUNNING;

                        if (vm->err_flag) {
                            vm->err_flag = false;
                            // the system native functions return the error message as a crispy string
                            print_value(res, true, false);
                            goto ERROR;
                        }

                    } else {
                        res = ((CrispyValue (*)(CrispyValue *)) n_fn->func_ptr)(args);
                    }

                    // pop
                    --sp;

                    PUSH(res);
                    break;
                }

                if (object->type != OBJ_LAMBDA) {
                    fprintf(stderr, "Trying to call non callable Object\n");
                    goto ERROR;
                }
                ObjLambda *lambda = ((ObjLambda *) object);

                uint8_t expected = lambda->num_params;
                if (expected != num_args) {
                    fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                    goto ERROR;
                }

                // Pop arguments from stack
                CrispyValue args[num_args];
                for (int i = 0; i < num_args; ++i) {
                    args[i] = POP();
                }

                // Create a temp callframe with its own var array
                // otherwise recursion would override the variables of its predecessors on the callstack
                CallFrame *call_frame = new_temp_call_frame(lambda->call_frame);

                PUSH_FRAME(vm, call_frame);
                CrispyValue *before_sp = sp;

                for (int i = 0; i < num_args; ++i) {
                    PUSH(args[i]);
                }

                vm->sp = sp;
                InterpretResult result = run(vm);

                // free temp callframe
                temp_call_frame_free(POP_FRAME(vm));

                if (result != INTERPRET_OK) {
                    return result;
                }

                sp = before_sp;
                break;
            }
            case OP_ADD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type == NUMBER && second.type == NUMBER) {
                    first.d_value += second.d_value;
                    PUSH(first);
                    break;
                }

                if (first.type == OBJECT) {
                    Object *first_obj = first.o_value;
                    first_obj->marked = true;

                    switch (first_obj->type) {
                        case OBJ_STRING: {
                            if (second.type != OBJECT || second.o_value->type != OBJ_STRING) {
                                fprintf(stderr,
                                        "Only strings can be appended to strings. Consider using the 'str' function\n");
                                goto ERROR;
                            }
                            ObjString *first_str = (ObjString *) first_obj;
                            ObjString *second_str = (ObjString *) second.o_value;
                            second_str->object.marked = true;

                            ObjString *dest = new_empty_string(vm, (first_str->length + second_str->length));

                            memcpy((char *) dest->start, first_str->start, first_str->length);
                            memcpy((char *) (dest->start + first_str->length), second_str->start, second_str->length);

                            PUSH(create_object((Object *) dest));
                            break;
                        }
                        case OBJ_LIST: {
                            ObjList *clone = clone_list(vm, (ObjList *) first_obj);
                            list_append(clone, second);

                            PUSH(create_object((Object *) clone));
                            break;
                        }
                        default:
                            fprintf(stderr, "Invalid target for addition\n");
                            goto ERROR;
                    }
                } else {
                    fprintf(stderr, "Invalid target for addition\n");
                    goto ERROR;
                }

                break;
            }
            case OP_SUB:
                BINARY_OP(-);
                break;
            case OP_MUL:
                BINARY_OP(*);
                break;
            case OP_MOD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != NUMBER || second.type != NUMBER) {
                    fprintf(stderr, "Modulo operator (%%) only works on numbers\n");
                    goto ERROR;
                }

                int64_t first_int = (int64_t) first.d_value;
                int64_t second_int = (int64_t) second.d_value;

                PUSH(create_number(first_int % second_int));
                break;
            }
            case OP_DIV: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                if (!CHECK_NUM(first) || !CHECK_NUM(second)) {
                    goto ERROR;
                }

                if (second.d_value == 0) {
                    panic(vm, "Cannot divide by zero\n");
                }

                first.d_value = first.d_value / second.d_value;
                PUSH(first);
                break;
            }
            case OP_POW: {
                CrispyValue exponent = POP();
                CrispyValue base = POP();

                if (!CHECK_NUM(base) || !CHECK_NUM(exponent)) {
                    goto ERROR;
                }

                PUSH(create_number(pow(base.d_value, exponent.d_value)));

                break;
            }
            case OP_OR: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value || second.p_value));

                break;
            }
            case OP_AND: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value && second.p_value));

                break;
            }
            case OP_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) == 0));
                break;
            }
            case OP_NOT_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) != 0));
                break;
            }
            case OP_GE: {
                // TODO exception for non orderable type (e.g nil)
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) >= 0));
                break;
            }
            case OP_LE: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) <= 0));
                break;
            }
            case OP_GT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) > 0));
                break;
            }
            case OP_LT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) < 0));
                break;
            }
            case OP_NEGATE: {
                CrispyValue val = create_number(POP().d_value * -1);
                PUSH(val);
                break;
            }
            case OP_LOAD: {
                CrispyValue val = READ_VAR();
                PUSH(val);
                break;
            }
            case OP_LOAD_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = frame->variables.values[index];

                PUSH(val);

                break;
            }
            case OP_STORE_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = POP();

                frame->variables.values[index] = val;
                break;
            }
            case OP_STORE: {
                uint8_t index = READ_BYTE();
                CrispyValue val = POP();
                write_at(variables, index, val);
                break;
            }
            case OP_POP:
                --sp;
                break;
            case OP_DUP: {
                CrispyValue val = PEEK();
                PUSH(val);
                break;
            }
            case OP_JMP:
                ip = code + READ_SHORT();
                break;
            case OP_JMT: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JMF: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (!BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JEQ:
                COND_JUMP(==);
                break;
            case OP_JNE:
                COND_JUMP(!=);
                break;
            case OP_JLT:
                COND_JUMP(<);
                break;
            case OP_JLE:
                COND_JUMP(<=);
                break;
            case OP_JGT:
                COND_JUMP(>);
                break;
            case OP_JGE:
                COND_JUMP(>=);
                break;
            case OP_INC_1: {
                uint8_t index = READ_BYTE();
                ++variables->values[index].d_value;
                break;
            }
            case OP_DEC_1: {
                uint8_t index = READ_BYTE();
                --variables->values[index].d_value;
                break;
            }
            case OP_NOT: {
                CrispyValue value = POP();

                if (value.type != BOOLEAN) {
                    goto ERROR;
                }

                value.p_value = value.p_value == 0 ? 1 : 0;
                PUSH(value);
                break;
            }
            case OP_TRUE:
                PUSH(create_bool(true));
                break;
            case OP_FALSE:
                PUSH(create_bool(false));
                break;
            case OP_NOP:
                PUSH(create_bool(false));
                break;
            case OP_NIL:
                PUSH(create_nil());
                break;
            case OP_PRINT: {
                CrispyValue value = POP();
                printf("> ");
                print_value(value, true, true);
                break;
            }
            case OP_DICT_NEW: {
                HashTable content;
                ht_init(&content, HT_KEY_OBJSTRING, 8, free_objstring);

                ObjDict *dict = new_dict(vm, content);
                CrispyValue value = create_object((Object *) dict);
                PUSH(value);
                break;
            }
            case OP_LIST_NEW: {
                ObjList *list = new_list(vm, 0);
                CrispyValue list_val = create_object((Object *) list);

                PUSH(list_val);
                break;
            }
            case OP_LIST_APPEND: {
                CrispyValue value = POP();
                CrispyValue list_val = PEEK();

                if (list_val.type != OBJECT || list_val.o_value->type != OBJ_LIST) {
                    fprintf(stderr, "Can only put values into lists\n");
                    goto ERROR;
                }

                ObjList *list = (ObjList *) list_val.o_value;

                list_append(list, value);
                break;
            }
            case OP_STRUCT_SET: {
                CrispyValue value = POP();
                CrispyValue key = POP();
                CrispyValue structure = PEEK();

                if (structure.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = structure.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) obj;

                        if (key.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        HTItemKey ht_key;
                        Object *key_obj = key.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ht_key.key_obj_string = (ObjString *) key_obj;
                        ht_put(&dict->content, ht_key, value);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key.type != NUMBER || floor(key.d_value) != key.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key.d_value;
                        bool success = list_add(list, index, value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for set operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_GET: {
                CrispyValue key_val = POP();
                CrispyValue struct_val = POP();

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        if (key_val.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }


                        ObjDict *dict = (ObjDict *) obj;
                        Object *key_obj = key_val.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ObjString *key_string = (ObjString *) key_obj;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_PEEK: {
                CrispyValue key_val = PEEK();
                CrispyValue struct_val = sp[-2];

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) struct_val.o_value;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        uint32_t index = (uint32_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) struct_val.o_value;
                        ObjString *key_string = (ObjString *) key_val.o_value;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            default:
                printf("Unknown instruction %d\n", instruction);
                return INTERPRET_RUNTIME_ERROR;
        }
    }

    ERROR:
    return INTERPRET_RUNTIME_ERROR;

#undef COND_JUMP
#undef BINARY_OP
#undef PEEK
#undef PUSH
#undef POP
#undef READ_VAR
#undef READ_CONST
#undef READ_CONST_W
#undef READ_SHORT
#undef READ_BYTE
}